

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlVoid.cpp
# Opt level: O3

uint64 __thiscall
libebml::EbmlVoid::ReplaceWith
          (EbmlVoid *this,EbmlElement *EltToReplaceWith,IOCallback *output,bool ComeBackAfterward,
          bool bWithDefault)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined7 in_register_00000081;
  byte bVar11;
  byte bVar12;
  uint64 uVar13;
  EbmlVoid aTmp;
  EbmlBinary local_78;
  undefined8 local_38;
  
  uVar13 = 0;
  (*EltToReplaceWith->_vptr_EbmlElement[8])
            (EltToReplaceWith,CONCAT71(in_register_00000081,bWithDefault) & 0xffffffff,0);
  iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
  iVar4 = *(int *)(CONCAT44(extraout_var,iVar4) + 8);
  iVar5 = CodedSizeLength((this->super_EbmlBinary).super_EbmlElement.Size,
                          (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                          (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
  iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
  iVar7 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
  iVar8 = (*EltToReplaceWith->_vptr_EbmlElement[3])(EltToReplaceWith);
  iVar8 = *(int *)(CONCAT44(extraout_var_02,iVar8) + 8);
  iVar9 = CodedSizeLength(EltToReplaceWith->Size,EltToReplaceWith->SizeLength,
                          EltToReplaceWith->bSizeIsFinite);
  if ((ulong)(iVar9 + iVar8 & 0xff) + CONCAT44(extraout_var_01,iVar7) <=
      CONCAT44(extraout_var_00,iVar6) + (ulong)(iVar5 + iVar4 & 0xff)) {
    iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
    iVar4 = *(int *)(CONCAT44(extraout_var_03,iVar4) + 8);
    iVar5 = CodedSizeLength((this->super_EbmlBinary).super_EbmlElement.Size,
                            (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                            (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
    iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
    iVar7 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
    iVar8 = (*EltToReplaceWith->_vptr_EbmlElement[3])(EltToReplaceWith);
    iVar8 = *(int *)(CONCAT44(extraout_var_06,iVar8) + 8);
    iVar9 = CodedSizeLength(EltToReplaceWith->Size,EltToReplaceWith->SizeLength,
                            EltToReplaceWith->bSizeIsFinite);
    if ((CONCAT44(extraout_var_04,iVar6) + (ulong)(iVar5 + iVar4 & 0xff)) -
        ((ulong)(iVar9 + iVar8 & 0xff) + CONCAT44(extraout_var_05,iVar7)) == 1) {
      uVar13 = 0;
    }
    else {
      iVar4 = (*output->_vptr_IOCallback[5])(output);
      local_38 = CONCAT44(extraout_var_07,iVar4);
      (*output->_vptr_IOCallback[3])
                (output,(this->super_EbmlBinary).super_EbmlElement.ElementPosition,0);
      EbmlElement::Render(EltToReplaceWith,output,bWithDefault,false,false);
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
      iVar4 = *(int *)(CONCAT44(extraout_var_08,iVar4) + 8);
      iVar5 = CodedSizeLength((this->super_EbmlBinary).super_EbmlElement.Size,
                              (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                              (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
      iVar6 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar7 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
      iVar8 = (*EltToReplaceWith->_vptr_EbmlElement[3])(EltToReplaceWith);
      iVar8 = *(int *)(CONCAT44(extraout_var_11,iVar8) + 8);
      iVar9 = CodedSizeLength(EltToReplaceWith->Size,EltToReplaceWith->SizeLength,
                              EltToReplaceWith->bSizeIsFinite);
      if (1 < (CONCAT44(extraout_var_09,iVar6) + (ulong)(iVar5 + iVar4 & 0xff)) -
              ((ulong)(iVar9 + iVar8 & 0xff) + CONCAT44(extraout_var_10,iVar7))) {
        EbmlVoid((EbmlVoid *)&local_78);
        iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
        lVar1 = *(long *)(CONCAT44(extraout_var_12,iVar4) + 8);
        uVar10 = CodedSizeLength((this->super_EbmlBinary).super_EbmlElement.Size,
                                 (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                                 (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
        iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
        iVar8 = (*EltToReplaceWith->_vptr_EbmlElement[9])(EltToReplaceWith);
        iVar5 = (*EltToReplaceWith->_vptr_EbmlElement[3])(EltToReplaceWith);
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_15,iVar5) + 8);
        iVar5 = CodedSizeLength(EltToReplaceWith->Size,EltToReplaceWith->SizeLength,
                                EltToReplaceWith->bSizeIsFinite);
        local_78.super_EbmlElement.Size =
             ~((ulong)((int)uVar2 + iVar5 & 0xff) + CONCAT44(extraout_var_14,iVar8)) +
             CONCAT44(extraout_var_13,iVar4) + (lVar1 + (ulong)uVar10 & 0xff);
        iVar4 = (*local_78.super_EbmlElement._vptr_EbmlElement[3])();
        uVar2 = *(undefined8 *)(CONCAT44(extraout_var_16,iVar4) + 8);
        iVar4 = CodedSizeLength(local_78.super_EbmlElement.Size,
                                local_78.super_EbmlElement.SizeLength,
                                local_78.super_EbmlElement.bSizeIsFinite);
        uVar13 = local_78.super_EbmlElement.Size;
        iVar8 = CodedSizeLength(local_78.super_EbmlElement.Size,
                                local_78.super_EbmlElement.SizeLength,
                                local_78.super_EbmlElement.bSizeIsFinite);
        local_78.super_EbmlElement.Size = uVar13 - (long)iVar8;
        iVar8 = (*local_78.super_EbmlElement._vptr_EbmlElement[3])();
        uVar3 = *(undefined8 *)(CONCAT44(extraout_var_17,iVar8) + 8);
        iVar8 = CodedSizeLength(local_78.super_EbmlElement.Size,
                                local_78.super_EbmlElement.SizeLength,
                                local_78.super_EbmlElement.bSizeIsFinite);
        bVar12 = (char)uVar2 + (char)iVar4;
        bVar11 = (char)uVar3 + (char)iVar8;
        if (bVar12 != bVar11) {
          iVar4 = CodedSizeLength(local_78.super_EbmlElement.Size,
                                  local_78.super_EbmlElement.SizeLength,
                                  local_78.super_EbmlElement.bSizeIsFinite);
          local_78.super_EbmlElement.SizeLength = ((uint)bVar12 - (uint)bVar11) + iVar4;
        }
        EbmlElement::RenderHead(&local_78.super_EbmlElement,output,false,bWithDefault,false);
        EbmlBinary::~EbmlBinary(&local_78);
      }
      if (ComeBackAfterward) {
        (*output->_vptr_IOCallback[3])(output,local_38,0);
      }
      iVar8 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[9])(this);
      iVar4 = (*(this->super_EbmlBinary).super_EbmlElement._vptr_EbmlElement[3])(this);
      iVar4 = *(int *)(CONCAT44(extraout_var_19,iVar4) + 8);
      iVar5 = CodedSizeLength((this->super_EbmlBinary).super_EbmlElement.Size,
                              (this->super_EbmlBinary).super_EbmlElement.SizeLength,
                              (this->super_EbmlBinary).super_EbmlElement.bSizeIsFinite);
      uVar13 = (ulong)(iVar5 + iVar4 & 0xff) + CONCAT44(extraout_var_18,iVar8);
    }
  }
  return uVar13;
}

Assistant:

uint64 EbmlVoid::ReplaceWith(EbmlElement & EltToReplaceWith, IOCallback & output, bool ComeBackAfterward, bool bWithDefault)
{
  EltToReplaceWith.UpdateSize(bWithDefault);
  if (HeadSize() + GetSize() < EltToReplaceWith.GetSize() + EltToReplaceWith.HeadSize()) {
    // the element can't be written here !
    return INVALID_FILEPOS_T;
  }
  if (HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() == 1) {
    // there is not enough space to put a filling element
    return INVALID_FILEPOS_T;
  }

  uint64 CurrentPosition = output.getFilePointer();

  output.setFilePointer(GetElementPosition());
  EltToReplaceWith.Render(output, bWithDefault);

  if (HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() > 1) {
    // fill the rest with another void element
    EbmlVoid aTmp;
    aTmp.SetSize_(HeadSize() + GetSize() - EltToReplaceWith.GetSize() - EltToReplaceWith.HeadSize() - 1); // 1 is the length of the Void ID
    int HeadBefore = aTmp.HeadSize();
    aTmp.SetSize_(aTmp.GetSize() - CodedSizeLength(aTmp.GetSize(), aTmp.GetSizeLength(), aTmp.IsFiniteSize()));
    int HeadAfter = aTmp.HeadSize();
    if (HeadBefore != HeadAfter) {
      aTmp.SetSizeLength(CodedSizeLength(aTmp.GetSize(), aTmp.GetSizeLength(), aTmp.IsFiniteSize()) - (HeadAfter - HeadBefore));
    }
    aTmp.RenderHead(output, false, bWithDefault); // the rest of the data is not rewritten
  }

  if (ComeBackAfterward) {
    output.setFilePointer(CurrentPosition);
  }

  return GetSize() + HeadSize();
}